

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  int iVar1;
  uint local_24;
  Select *pSStack_20;
  int rc;
  Select *p_local;
  Walker *pWalker_local;
  
  if ((p == (Select *)0x0) || (pWalker->xSelectCallback == (_func_int_Walker_ptr_Select_ptr *)0x0))
  {
    pWalker_local._4_4_ = 0;
  }
  else {
    local_24 = 0;
    pWalker->walkerDepth = pWalker->walkerDepth + 1;
    pSStack_20 = p;
    while ((pSStack_20 != (Select *)0x0 &&
           ((pWalker->bSelectDepthFirst != '\0' ||
            (local_24 = (*pWalker->xSelectCallback)(pWalker,pSStack_20), local_24 == 0))))) {
      iVar1 = sqlite3WalkSelectExpr(pWalker,pSStack_20);
      if ((iVar1 != 0) || (iVar1 = sqlite3WalkSelectFrom(pWalker,pSStack_20), iVar1 != 0)) {
        pWalker->walkerDepth = pWalker->walkerDepth + -1;
        return 2;
      }
      if ((pWalker->bSelectDepthFirst != '\0') &&
         (local_24 = (*pWalker->xSelectCallback)(pWalker,pSStack_20), local_24 != 0)) break;
      pSStack_20 = pSStack_20->pPrior;
    }
    pWalker->walkerDepth = pWalker->walkerDepth + -1;
    pWalker_local._4_4_ = local_24 & 2;
  }
  return pWalker_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 || pWalker->xSelectCallback==0 ) return WRC_Continue;
  rc = WRC_Continue;
  pWalker->walkerDepth++;
  while( p ){
    if( !pWalker->bSelectDepthFirst ){
       rc = pWalker->xSelectCallback(pWalker, p);
       if( rc ) break;
    }
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      pWalker->walkerDepth--;
      return WRC_Abort;
    }
    if( pWalker->bSelectDepthFirst ){
      rc = pWalker->xSelectCallback(pWalker, p);
      /* Depth-first search is currently only used for
      ** selectAddSubqueryTypeInfo() and that routine always returns
      ** WRC_Continue (0).  So the following branch is never taken. */
      if( NEVER(rc) ) break;
    }
    p = p->pPrior;
  }
  pWalker->walkerDepth--;
  return rc & WRC_Abort;
}